

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

char * fmt::v10::detail::
       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_int>&>
                 (char *begin,char *end,format_string_checker<char,_unsigned_int> *handler)

{
  int id;
  char local_71;
  undefined1 auStack_60 [7];
  char c;
  id_adapter adapter;
  format_string_checker<char,_unsigned_int> *handler_local;
  char *end_local;
  char *begin_local;
  char c_1;
  char *local_10;
  
  end_local = begin + 1;
  adapter._8_8_ = handler;
  if (end_local == end) {
    format_string_checker<char,_unsigned_int>::on_error(handler,"invalid format string");
    return end;
  }
  if (*end_local == '}') {
    id = format_string_checker<char,_unsigned_int>::on_arg_id(handler);
    format_string_checker<char,_unsigned_int>::on_replacement_field(handler,id,end_local);
  }
  else if (*end_local == '{') {
    format_string_checker<char,_unsigned_int>::on_text(handler,end_local,begin + 2);
  }
  else {
    adapter.handler._0_4_ = 0;
    _auStack_60 = handler;
    if (end_local == end) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/fmtlib/repo/include/fmt/core.h"
                  ,0x8c2,anon_var_dwarf_3ea58f + 9);
    }
    if ((*end_local == '}') || (*end_local == ':')) {
      parse_replacement_field<char,_fmt::v10::detail::format_string_checker<char,_unsigned_int>_&>::
      id_adapter::on_auto((id_adapter *)auStack_60);
      local_10 = end_local;
    }
    else {
      local_10 = do_parse_arg_id<char,fmt::v10::detail::parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_int>&>(char_const*,char_const*,fmt::v10::detail::format_string_checker<char,unsigned_int>&)::id_adapter&>
                           (end_local,end,(id_adapter *)auStack_60);
    }
    end_local = local_10;
    if (local_10 == end) {
      local_71 = '\0';
    }
    else {
      local_71 = *local_10;
    }
    if (local_71 == '}') {
      format_string_checker<char,_unsigned_int>::on_replacement_field
                ((format_string_checker<char,_unsigned_int> *)adapter._8_8_,(int)adapter.handler,
                 local_10);
    }
    else {
      if (local_71 != ':') {
        format_string_checker<char,_unsigned_int>::on_error
                  ((format_string_checker<char,_unsigned_int> *)adapter._8_8_,
                   "missing \'}\' in format string");
        return end;
      }
      end_local = format_string_checker<char,_unsigned_int>::on_format_specs
                            ((format_string_checker<char,_unsigned_int> *)adapter._8_8_,
                             (int)adapter.handler,local_10 + 1,end);
      if ((end_local == end) || (*end_local != '}')) {
        format_string_checker<char,_unsigned_int>::on_error
                  ((format_string_checker<char,_unsigned_int> *)adapter._8_8_,
                   "unknown format specifier");
        return end;
      }
    }
  }
  return end_local + 1;
}

Assistant:

FMT_CONSTEXPR auto parse_replacement_field(const Char* begin, const Char* end,
                                           Handler&& handler) -> const Char* {
  struct id_adapter {
    Handler& handler;
    int arg_id;

    FMT_CONSTEXPR void on_auto() { arg_id = handler.on_arg_id(); }
    FMT_CONSTEXPR void on_index(int id) { arg_id = handler.on_arg_id(id); }
    FMT_CONSTEXPR void on_name(basic_string_view<Char> id) {
      arg_id = handler.on_arg_id(id);
    }
  };

  ++begin;
  if (begin == end) return handler.on_error("invalid format string"), end;
  if (*begin == '}') {
    handler.on_replacement_field(handler.on_arg_id(), begin);
  } else if (*begin == '{') {
    handler.on_text(begin, begin + 1);
  } else {
    auto adapter = id_adapter{handler, 0};
    begin = parse_arg_id(begin, end, adapter);
    Char c = begin != end ? *begin : Char();
    if (c == '}') {
      handler.on_replacement_field(adapter.arg_id, begin);
    } else if (c == ':') {
      begin = handler.on_format_specs(adapter.arg_id, begin + 1, end);
      if (begin == end || *begin != '}')
        return handler.on_error("unknown format specifier"), end;
    } else {
      return handler.on_error("missing '}' in format string"), end;
    }
  }
  return begin + 1;
}